

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O3

bool __thiscall
avro::BufferReader::read<unsigned_long>(BufferReader *this,unsigned_long *val,true_type *param_2)

{
  ulong uVar1;
  size_t __nbytes;
  
  uVar1 = *(ulong *)(this + 0x38);
  if (7 < uVar1) {
    __nbytes = *(size_t *)(*(long *)(this + 0x10) + 0x20);
    if ((*(long *)(*(long *)(this + 0x10) + 0x28) - *(long *)(this + 0x40)) - __nbytes < 8) {
      read(this,(int)val,(void *)0x8,__nbytes);
    }
    else {
      *val = *(unsigned_long *)(__nbytes + *(long *)(this + 0x40));
      incrementChunk(this,8);
    }
  }
  return 7 < uVar1;
}

Assistant:

bool read(T &val, const boost::true_type&)
    {
        if(sizeof(T) > bytesRemaining_) {
            return false;
        }

        if (sizeof(T) <= chunkRemaining()) {
            val = *(reinterpret_cast<const T*> (addr()));
            incrementChunk(sizeof(T));
        }
        else {
            read(reinterpret_cast<data_type *>(&val), sizeof(T));
        }
        return true;
    }